

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

ImGuiKey ImGui_ImplGlfw_KeyToImGuiKey(int key)

{
  int key_local;
  ImGuiKey local_4;
  
  switch(key) {
  case 0x20:
    local_4 = ImGuiKey_Space;
    break;
  default:
    local_4 = ImGuiKey_KeysData_OFFSET;
    break;
  case 0x27:
    local_4 = ImGuiKey_Apostrophe;
    break;
  case 0x2c:
    local_4 = ImGuiKey_Comma;
    break;
  case 0x2d:
    local_4 = ImGuiKey_Minus;
    break;
  case 0x2e:
    local_4 = ImGuiKey_Period;
    break;
  case 0x2f:
    local_4 = ImGuiKey_Slash;
    break;
  case 0x30:
    local_4 = ImGuiKey_0;
    break;
  case 0x31:
    local_4 = ImGuiKey_1;
    break;
  case 0x32:
    local_4 = ImGuiKey_2;
    break;
  case 0x33:
    local_4 = ImGuiKey_3;
    break;
  case 0x34:
    local_4 = ImGuiKey_4;
    break;
  case 0x35:
    local_4 = ImGuiKey_5;
    break;
  case 0x36:
    local_4 = ImGuiKey_6;
    break;
  case 0x37:
    local_4 = ImGuiKey_7;
    break;
  case 0x38:
    local_4 = ImGuiKey_8;
    break;
  case 0x39:
    local_4 = ImGuiKey_9;
    break;
  case 0x3b:
    local_4 = ImGuiKey_Semicolon;
    break;
  case 0x3d:
    local_4 = ImGuiKey_Equal;
    break;
  case 0x41:
    local_4 = ImGuiKey_A;
    break;
  case 0x42:
    local_4 = ImGuiKey_B;
    break;
  case 0x43:
    local_4 = ImGuiKey_C;
    break;
  case 0x44:
    local_4 = ImGuiKey_D;
    break;
  case 0x45:
    local_4 = ImGuiKey_E;
    break;
  case 0x46:
    local_4 = ImGuiKey_F;
    break;
  case 0x47:
    local_4 = ImGuiKey_G;
    break;
  case 0x48:
    local_4 = ImGuiKey_H;
    break;
  case 0x49:
    local_4 = ImGuiKey_I;
    break;
  case 0x4a:
    local_4 = ImGuiKey_J;
    break;
  case 0x4b:
    local_4 = ImGuiKey_K;
    break;
  case 0x4c:
    local_4 = ImGuiKey_L;
    break;
  case 0x4d:
    local_4 = ImGuiKey_M;
    break;
  case 0x4e:
    local_4 = ImGuiKey_N;
    break;
  case 0x4f:
    local_4 = ImGuiKey_O;
    break;
  case 0x50:
    local_4 = ImGuiKey_P;
    break;
  case 0x51:
    local_4 = ImGuiKey_Q;
    break;
  case 0x52:
    local_4 = ImGuiKey_R;
    break;
  case 0x53:
    local_4 = ImGuiKey_S;
    break;
  case 0x54:
    local_4 = ImGuiKey_T;
    break;
  case 0x55:
    local_4 = ImGuiKey_U;
    break;
  case 0x56:
    local_4 = ImGuiKey_V;
    break;
  case 0x57:
    local_4 = ImGuiKey_W;
    break;
  case 0x58:
    local_4 = ImGuiKey_X;
    break;
  case 0x59:
    local_4 = ImGuiKey_Y;
    break;
  case 0x5a:
    local_4 = ImGuiKey_Z;
    break;
  case 0x5b:
    local_4 = ImGuiKey_LeftBracket;
    break;
  case 0x5c:
    local_4 = ImGuiKey_Backslash;
    break;
  case 0x5d:
    local_4 = ImGuiKey_RightBracket;
    break;
  case 0x60:
    local_4 = ImGuiKey_GraveAccent;
    break;
  case 0x100:
    local_4 = ImGuiKey_Escape;
    break;
  case 0x101:
    local_4 = ImGuiKey_Enter;
    break;
  case 0x102:
    local_4 = ImGuiKey_NamedKey_BEGIN;
    break;
  case 0x103:
    local_4 = ImGuiKey_Backspace;
    break;
  case 0x104:
    local_4 = ImGuiKey_Insert;
    break;
  case 0x105:
    local_4 = ImGuiKey_Delete;
    break;
  case 0x106:
    local_4 = ImGuiKey_RightArrow;
    break;
  case 0x107:
    local_4 = ImGuiKey_LeftArrow;
    break;
  case 0x108:
    local_4 = ImGuiKey_DownArrow;
    break;
  case 0x109:
    local_4 = ImGuiKey_UpArrow;
    break;
  case 0x10a:
    local_4 = ImGuiKey_PageUp;
    break;
  case 0x10b:
    local_4 = ImGuiKey_PageDown;
    break;
  case 0x10c:
    local_4 = ImGuiKey_Home;
    break;
  case 0x10d:
    local_4 = ImGuiKey_End;
    break;
  case 0x118:
    local_4 = ImGuiKey_CapsLock;
    break;
  case 0x119:
    local_4 = ImGuiKey_ScrollLock;
    break;
  case 0x11a:
    local_4 = ImGuiKey_NumLock;
    break;
  case 0x11b:
    local_4 = ImGuiKey_PrintScreen;
    break;
  case 0x11c:
    local_4 = ImGuiKey_Pause;
    break;
  case 0x122:
    local_4 = ImGuiKey_F1;
    break;
  case 0x123:
    local_4 = ImGuiKey_F2;
    break;
  case 0x124:
    local_4 = ImGuiKey_F3;
    break;
  case 0x125:
    local_4 = ImGuiKey_F4;
    break;
  case 0x126:
    local_4 = ImGuiKey_F5;
    break;
  case 0x127:
    local_4 = ImGuiKey_F6;
    break;
  case 0x128:
    local_4 = ImGuiKey_F7;
    break;
  case 0x129:
    local_4 = ImGuiKey_F8;
    break;
  case 0x12a:
    local_4 = ImGuiKey_F9;
    break;
  case 299:
    local_4 = ImGuiKey_F10;
    break;
  case 300:
    local_4 = ImGuiKey_F11;
    break;
  case 0x12d:
    local_4 = ImGuiKey_F12;
    break;
  case 0x140:
    local_4 = ImGuiKey_Keypad0;
    break;
  case 0x141:
    local_4 = ImGuiKey_Keypad1;
    break;
  case 0x142:
    local_4 = ImGuiKey_Keypad2;
    break;
  case 0x143:
    local_4 = ImGuiKey_Keypad3;
    break;
  case 0x144:
    local_4 = ImGuiKey_Keypad4;
    break;
  case 0x145:
    local_4 = ImGuiKey_Keypad5;
    break;
  case 0x146:
    local_4 = ImGuiKey_Keypad6;
    break;
  case 0x147:
    local_4 = ImGuiKey_Keypad7;
    break;
  case 0x148:
    local_4 = ImGuiKey_Keypad8;
    break;
  case 0x149:
    local_4 = ImGuiKey_Keypad9;
    break;
  case 0x14a:
    local_4 = ImGuiKey_KeypadDecimal;
    break;
  case 0x14b:
    local_4 = ImGuiKey_KeypadDivide;
    break;
  case 0x14c:
    local_4 = ImGuiKey_KeypadMultiply;
    break;
  case 0x14d:
    local_4 = ImGuiKey_KeypadSubtract;
    break;
  case 0x14e:
    local_4 = ImGuiKey_KeypadAdd;
    break;
  case 0x14f:
    local_4 = ImGuiKey_KeyPadEnter;
    break;
  case 0x150:
    local_4 = ImGuiKey_KeypadEqual;
    break;
  case 0x154:
    local_4 = ImGuiKey_LeftShift;
    break;
  case 0x155:
    local_4 = ImGuiKey_LeftCtrl;
    break;
  case 0x156:
    local_4 = ImGuiKey_LeftAlt;
    break;
  case 0x157:
    local_4 = ImGuiKey_LeftSuper;
    break;
  case 0x158:
    local_4 = ImGuiKey_RightShift;
    break;
  case 0x159:
    local_4 = ImGuiKey_RightCtrl;
    break;
  case 0x15a:
    local_4 = ImGuiKey_RightAlt;
    break;
  case 0x15b:
    local_4 = ImGuiKey_RightSuper;
    break;
  case 0x15c:
    local_4 = ImGuiKey_Menu;
  }
  return local_4;
}

Assistant:

static ImGuiKey ImGui_ImplGlfw_KeyToImGuiKey(int key)
{
    switch (key)
    {
        case GLFW_KEY_TAB: return ImGuiKey_Tab;
        case GLFW_KEY_LEFT: return ImGuiKey_LeftArrow;
        case GLFW_KEY_RIGHT: return ImGuiKey_RightArrow;
        case GLFW_KEY_UP: return ImGuiKey_UpArrow;
        case GLFW_KEY_DOWN: return ImGuiKey_DownArrow;
        case GLFW_KEY_PAGE_UP: return ImGuiKey_PageUp;
        case GLFW_KEY_PAGE_DOWN: return ImGuiKey_PageDown;
        case GLFW_KEY_HOME: return ImGuiKey_Home;
        case GLFW_KEY_END: return ImGuiKey_End;
        case GLFW_KEY_INSERT: return ImGuiKey_Insert;
        case GLFW_KEY_DELETE: return ImGuiKey_Delete;
        case GLFW_KEY_BACKSPACE: return ImGuiKey_Backspace;
        case GLFW_KEY_SPACE: return ImGuiKey_Space;
        case GLFW_KEY_ENTER: return ImGuiKey_Enter;
        case GLFW_KEY_ESCAPE: return ImGuiKey_Escape;
        case GLFW_KEY_APOSTROPHE: return ImGuiKey_Apostrophe;
        case GLFW_KEY_COMMA: return ImGuiKey_Comma;
        case GLFW_KEY_MINUS: return ImGuiKey_Minus;
        case GLFW_KEY_PERIOD: return ImGuiKey_Period;
        case GLFW_KEY_SLASH: return ImGuiKey_Slash;
        case GLFW_KEY_SEMICOLON: return ImGuiKey_Semicolon;
        case GLFW_KEY_EQUAL: return ImGuiKey_Equal;
        case GLFW_KEY_LEFT_BRACKET: return ImGuiKey_LeftBracket;
        case GLFW_KEY_BACKSLASH: return ImGuiKey_Backslash;
        case GLFW_KEY_RIGHT_BRACKET: return ImGuiKey_RightBracket;
        case GLFW_KEY_GRAVE_ACCENT: return ImGuiKey_GraveAccent;
        case GLFW_KEY_CAPS_LOCK: return ImGuiKey_CapsLock;
        case GLFW_KEY_SCROLL_LOCK: return ImGuiKey_ScrollLock;
        case GLFW_KEY_NUM_LOCK: return ImGuiKey_NumLock;
        case GLFW_KEY_PRINT_SCREEN: return ImGuiKey_PrintScreen;
        case GLFW_KEY_PAUSE: return ImGuiKey_Pause;
        case GLFW_KEY_KP_0: return ImGuiKey_Keypad0;
        case GLFW_KEY_KP_1: return ImGuiKey_Keypad1;
        case GLFW_KEY_KP_2: return ImGuiKey_Keypad2;
        case GLFW_KEY_KP_3: return ImGuiKey_Keypad3;
        case GLFW_KEY_KP_4: return ImGuiKey_Keypad4;
        case GLFW_KEY_KP_5: return ImGuiKey_Keypad5;
        case GLFW_KEY_KP_6: return ImGuiKey_Keypad6;
        case GLFW_KEY_KP_7: return ImGuiKey_Keypad7;
        case GLFW_KEY_KP_8: return ImGuiKey_Keypad8;
        case GLFW_KEY_KP_9: return ImGuiKey_Keypad9;
        case GLFW_KEY_KP_DECIMAL: return ImGuiKey_KeypadDecimal;
        case GLFW_KEY_KP_DIVIDE: return ImGuiKey_KeypadDivide;
        case GLFW_KEY_KP_MULTIPLY: return ImGuiKey_KeypadMultiply;
        case GLFW_KEY_KP_SUBTRACT: return ImGuiKey_KeypadSubtract;
        case GLFW_KEY_KP_ADD: return ImGuiKey_KeypadAdd;
        case GLFW_KEY_KP_ENTER: return ImGuiKey_KeypadEnter;
        case GLFW_KEY_KP_EQUAL: return ImGuiKey_KeypadEqual;
        case GLFW_KEY_LEFT_SHIFT: return ImGuiKey_LeftShift;
        case GLFW_KEY_LEFT_CONTROL: return ImGuiKey_LeftCtrl;
        case GLFW_KEY_LEFT_ALT: return ImGuiKey_LeftAlt;
        case GLFW_KEY_LEFT_SUPER: return ImGuiKey_LeftSuper;
        case GLFW_KEY_RIGHT_SHIFT: return ImGuiKey_RightShift;
        case GLFW_KEY_RIGHT_CONTROL: return ImGuiKey_RightCtrl;
        case GLFW_KEY_RIGHT_ALT: return ImGuiKey_RightAlt;
        case GLFW_KEY_RIGHT_SUPER: return ImGuiKey_RightSuper;
        case GLFW_KEY_MENU: return ImGuiKey_Menu;
        case GLFW_KEY_0: return ImGuiKey_0;
        case GLFW_KEY_1: return ImGuiKey_1;
        case GLFW_KEY_2: return ImGuiKey_2;
        case GLFW_KEY_3: return ImGuiKey_3;
        case GLFW_KEY_4: return ImGuiKey_4;
        case GLFW_KEY_5: return ImGuiKey_5;
        case GLFW_KEY_6: return ImGuiKey_6;
        case GLFW_KEY_7: return ImGuiKey_7;
        case GLFW_KEY_8: return ImGuiKey_8;
        case GLFW_KEY_9: return ImGuiKey_9;
        case GLFW_KEY_A: return ImGuiKey_A;
        case GLFW_KEY_B: return ImGuiKey_B;
        case GLFW_KEY_C: return ImGuiKey_C;
        case GLFW_KEY_D: return ImGuiKey_D;
        case GLFW_KEY_E: return ImGuiKey_E;
        case GLFW_KEY_F: return ImGuiKey_F;
        case GLFW_KEY_G: return ImGuiKey_G;
        case GLFW_KEY_H: return ImGuiKey_H;
        case GLFW_KEY_I: return ImGuiKey_I;
        case GLFW_KEY_J: return ImGuiKey_J;
        case GLFW_KEY_K: return ImGuiKey_K;
        case GLFW_KEY_L: return ImGuiKey_L;
        case GLFW_KEY_M: return ImGuiKey_M;
        case GLFW_KEY_N: return ImGuiKey_N;
        case GLFW_KEY_O: return ImGuiKey_O;
        case GLFW_KEY_P: return ImGuiKey_P;
        case GLFW_KEY_Q: return ImGuiKey_Q;
        case GLFW_KEY_R: return ImGuiKey_R;
        case GLFW_KEY_S: return ImGuiKey_S;
        case GLFW_KEY_T: return ImGuiKey_T;
        case GLFW_KEY_U: return ImGuiKey_U;
        case GLFW_KEY_V: return ImGuiKey_V;
        case GLFW_KEY_W: return ImGuiKey_W;
        case GLFW_KEY_X: return ImGuiKey_X;
        case GLFW_KEY_Y: return ImGuiKey_Y;
        case GLFW_KEY_Z: return ImGuiKey_Z;
        case GLFW_KEY_F1: return ImGuiKey_F1;
        case GLFW_KEY_F2: return ImGuiKey_F2;
        case GLFW_KEY_F3: return ImGuiKey_F3;
        case GLFW_KEY_F4: return ImGuiKey_F4;
        case GLFW_KEY_F5: return ImGuiKey_F5;
        case GLFW_KEY_F6: return ImGuiKey_F6;
        case GLFW_KEY_F7: return ImGuiKey_F7;
        case GLFW_KEY_F8: return ImGuiKey_F8;
        case GLFW_KEY_F9: return ImGuiKey_F9;
        case GLFW_KEY_F10: return ImGuiKey_F10;
        case GLFW_KEY_F11: return ImGuiKey_F11;
        case GLFW_KEY_F12: return ImGuiKey_F12;
        default: return ImGuiKey_None;
    }
}